

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O0

int Dsm_ManTruthToGia(void *p,word *pTruth,Vec_Int_t *vLeaves,Vec_Int_t *vCover)

{
  int iVar1;
  int *piVar2;
  int pVarLevels [12];
  int iLit;
  int i;
  word pTruthCopy [64];
  char pDsd [1000];
  int nSizeNonDec;
  Gia_Man_t *pGia;
  int fDelayBalance;
  int fUseMuxes;
  Vec_Int_t *vCover_local;
  Vec_Int_t *vLeaves_local;
  word *pTruth_local;
  void *p_local;
  
  iVar1 = Vec_IntSize(vLeaves);
  iVar1 = Abc_TtWordNum(iVar1);
  Abc_TtCopy((word *)&iLit,pTruth,iVar1,0);
  m_Calls = m_Calls + 1;
  iVar1 = Vec_IntSize(vLeaves);
  if (iVar1 < 0xd) {
    iVar1 = Vec_IntSize(vLeaves);
    if (iVar1 == 0) {
      p_local._4_4_ = (uint)*pTruth & 1;
    }
    else {
      iVar1 = Vec_IntSize(vLeaves);
      if (iVar1 == 1) {
        iVar1 = Vec_IntEntry(vLeaves,0);
        p_local._4_4_ = Abc_LitNotCond(iVar1,(uint)*pTruth & 1);
      }
      else {
        iVar1 = Vec_IntSize(vLeaves);
        iVar1 = Dau_DsdDecompose((word *)&iLit,iVar1,0,1,(char *)(pTruthCopy + 0x3f));
        if (iVar1 != 0) {
          m_NonDsd = m_NonDsd + 1;
        }
        if (*(long *)((long)p + 0xa0) == 0) {
          piVar2 = Vec_IntArray(vLeaves);
          p_local._4_4_ = Dau_DsdToGia2((Gia_Man_t *)p,(char *)(pTruthCopy + 0x3f),piVar2,vCover);
        }
        else {
          piVar2 = Vec_IntArray(vLeaves);
          p_local._4_4_ = Dau_DsdToGia((Gia_Man_t *)p,(char *)(pTruthCopy + 0x3f),piVar2,vCover);
        }
      }
    }
    return p_local._4_4_;
  }
  __assert_fail("Vec_IntSize(vLeaves) <= DAU_DSD_MAX_VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauGia.c"
                ,0x1c3,"int Dsm_ManTruthToGia(void *, word *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Dsm_ManTruthToGia( void * p, word * pTruth, Vec_Int_t * vLeaves, Vec_Int_t * vCover )
{
    int fUseMuxes = 0;
    int fDelayBalance = 1;
    Gia_Man_t * pGia = (Gia_Man_t *)p;
    int nSizeNonDec;
    char pDsd[1000];
    word pTruthCopy[DAU_MAX_WORD];
    Abc_TtCopy( pTruthCopy, pTruth, Abc_TtWordNum(Vec_IntSize(vLeaves)), 0 );
    m_Calls++;
    assert( Vec_IntSize(vLeaves) <= DAU_DSD_MAX_VAR );
    if ( Vec_IntSize(vLeaves) == 0 )
        return (int)(pTruth[0] & 1);
    if ( Vec_IntSize(vLeaves) == 1 )
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, 0), (int)(pTruth[0] & 1) );
    // collect delay information
    if ( fDelayBalance && fUseMuxes )
    {
        int i, iLit, pVarLevels[DAU_DSD_MAX_VAR];
        Vec_IntForEachEntry( vLeaves, iLit, i )
            pVarLevels[i] = Gia_ObjLevelId( pGia, Abc_Lit2Var(iLit) );
        nSizeNonDec = Dau_DsdDecomposeLevel( pTruthCopy, Vec_IntSize(vLeaves), fUseMuxes, 1, pDsd, pVarLevels );
    }
    else
        nSizeNonDec = Dau_DsdDecompose( pTruthCopy, Vec_IntSize(vLeaves), fUseMuxes, 1, pDsd );
    if ( nSizeNonDec )
        m_NonDsd++;
//    printf( "%s\n", pDsd );
    if ( fDelayBalance && pGia->vLevels )
        return Dau_DsdToGia( pGia, pDsd, Vec_IntArray(vLeaves), vCover );
    else
        return Dau_DsdToGia2( pGia, pDsd, Vec_IntArray(vLeaves), vCover );
}